

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void FAudio_INTERNAL_DecodePCM24
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  FAudioWaveFormatEx *pFVar3;
  byte *pbVar4;
  ulong uVar5;
  
  pFVar3 = (voice->field_19).src.format;
  puVar1 = buffer->pAudioData + (uint)pFVar3->nBlockAlign * (voice->field_19).src.curBufferOffset;
  for (uVar2 = 0; uVar2 != samples; uVar2 = uVar2 + 1) {
    pbVar4 = puVar1 + 2;
    for (uVar5 = 0; uVar5 < pFVar3->nChannels; uVar5 = uVar5 + 1) {
      *decodeCache = (float)((int)((uint)pbVar4[-2] << 8 |
                                  (uint)pbVar4[-1] << 0x10 | (uint)*pbVar4 << 0x18) >> 8) /
                     8388607.0;
      decodeCache = decodeCache + 1;
      pFVar3 = (voice->field_19).src.format;
      pbVar4 = pbVar4 + 3;
    }
    puVar1 = puVar1 + pFVar3->nBlockAlign;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM24(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	uint32_t i, j;
	const uint8_t *buf;
	LOG_FUNC_ENTER(voice->audio)

	/* FIXME: Uh... is this something that can be SIMD-ified? */
	buf = buffer->pAudioData + (
		voice->src.curBufferOffset * voice->src.format->nBlockAlign
	);
	for (i = 0; i < samples; i += 1, buf += voice->src.format->nBlockAlign)
	for (j = 0; j < voice->src.format->nChannels; j += 1)
	{
		*decodeCache++ = ((int32_t) (
			((uint32_t) buf[(j * 3) + 2] << 24) |
			((uint32_t) buf[(j * 3) + 1] << 16) |
			((uint32_t) buf[(j * 3) + 0] << 8)
		) >> 8) / 8388607.0f;
	}

	LOG_FUNC_EXIT(voice->audio)
}